

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O3

void __thiscall DIS::ServiceRequestPdu::ServiceRequestPdu(ServiceRequestPdu *this)

{
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ServiceRequestPdu_001a1040;
  EntityID::EntityID(&this->_requestingEntityID);
  EntityID::EntityID(&this->_servicingEntityID);
  this->_serviceTypeRequested = '\0';
  this->_numberOfSupplyTypes = '\0';
  this->_serviceRequestPadding = 0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'\x05');
  return;
}

Assistant:

ServiceRequestPdu::ServiceRequestPdu() : LogisticsFamilyPdu(),
   _requestingEntityID(), 
   _servicingEntityID(), 
   _serviceTypeRequested(0), 
   _numberOfSupplyTypes(0), 
   _serviceRequestPadding(0)
{
    setPduType( 5 );
}